

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlnumber.c
# Opt level: O0

err_t RenderDataInt(ebml_integer *Element,stream *Output,bool_t bForceWithoutMandatory,
                   bool_t bWithDefault,int ForProfile,filepos_t *Rendered)

{
  ebml_integer *local_60;
  err_t Err;
  uint64_t TempValue;
  size_t i;
  uint8_t FinalData [8];
  filepos_t *Rendered_local;
  int ForProfile_local;
  bool_t bWithDefault_local;
  bool_t bForceWithoutMandatory_local;
  stream *Output_local;
  ebml_integer *Element_local;
  
  if ((Element->Base).SizeLength < '\t') {
    if ((Element->Base).DataSize == 0) {
      Element_local = (ebml_integer *)0x0;
    }
    else {
      Err = Element->Value;
      FinalData = (uint8_t  [8])Rendered;
      if ((Element->Base).DataSize < (long)(Element->Base).DefaultSize) {
        for (TempValue = (uint64_t)
                         (((Element->Base).DefaultSize - (int)(Element->Base).DataSize) + -1);
            TempValue != 0; TempValue = TempValue - 1) {
          *(undefined1 *)((long)&TempValue + TempValue + 7) = 0;
        }
        TempValue = (uint64_t)((Element->Base).DefaultSize - (int)(Element->Base).DataSize);
      }
      else {
        TempValue = (Element->Base).DataSize;
      }
      for (; TempValue != 0; TempValue = TempValue - 1) {
        *(char *)((long)&TempValue + TempValue + 7) = (char)Err;
        Err = (ulong)Err >> 8;
      }
      if ((Element->Base).DataSize < (long)(Element->Base).DefaultSize) {
        if (Output == (stream *)0x0) {
          __assert_fail("(const void*)(Output)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlnumber.c"
                        ,0x9b,
                        "err_t RenderDataInt(ebml_integer *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                       );
        }
        local_60 = (ebml_integer *)
                   (**(code **)((long)(Output->Base).VMT + 0x70))
                             (Output,&i,(long)(Element->Base).DefaultSize,&TempValue);
      }
      else {
        if (Output == (stream *)0x0) {
          __assert_fail("(const void*)(Output)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlnumber.c"
                        ,0x9d,
                        "err_t RenderDataInt(ebml_integer *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                       );
        }
        local_60 = (ebml_integer *)
                   (**(code **)((long)(Output->Base).VMT + 0x70))
                             (Output,&i,(Element->Base).DataSize,&TempValue);
      }
      if (FinalData != (uint8_t  [8])0x0) {
        *(uint64_t *)FinalData = TempValue;
      }
      Element_local = local_60;
    }
  }
  else {
    Element_local = (ebml_integer *)0x0;
  }
  return (err_t)Element_local;
}

Assistant:

static err_t RenderDataInt(ebml_integer *Element, struct stream *Output, bool_t UNUSED_PARAM(bForceWithoutMandatory), bool_t UNUSED_PARAM(bWithDefault), int UNUSED_PARAM(ForProfile), filepos_t *Rendered)
{
    uint8_t FinalData[8]; // we don't handle more than 64 bits integers
    size_t i;
    uint64_t TempValue = Element->Value;
    err_t Err;

    if (Element->Base.SizeLength > EBML_MAX_SIZE)
        return 0; // integers larger than 64 bits are not supported

    if (Element->Base.DataSize == 0)
        return 0; // nothing to write

    TempValue = Element->Value;
    if (Element->Base.DefaultSize > Element->Base.DataSize)
    {
        for (i=Element->Base.DefaultSize - (int)Element->Base.DataSize - 1;i;--i)
            FinalData[i-1] = 0;
        i = Element->Base.DefaultSize - (int)Element->Base.DataSize;
    }
    else
        i=(size_t)Element->Base.DataSize;
    for (;i;--i) {
        FinalData[i-1] = (uint8_t)(TempValue & 0xFF);
        TempValue >>= 8;
    }

    if (Element->Base.DefaultSize > Element->Base.DataSize)
        Err = Stream_Write(Output,FinalData,(size_t)Element->Base.DefaultSize,&i);
    else
        Err = Stream_Write(Output,FinalData,(size_t)Element->Base.DataSize,&i);
    if (Rendered)
        *Rendered = i;
    return Err;
}